

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O2

void duckdb::ListDistinctFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  bool bVar1;
  reference vec;
  BoundFunctionExpression *pBVar2;
  pointer pFVar3;
  pointer pEVar4;
  BoundAggregateExpression *pBVar5;
  FunctionLocalState *pFVar6;
  idx_t iVar7;
  Vector *this;
  ulong uVar8;
  reference other;
  data_ptr_t pdVar9;
  idx_t row_idx;
  idx_t count;
  idx_t child_idx;
  ulong uVar10;
  idx_t iVar11;
  long *plVar12;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_2a8;
  idx_t local_2a0;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false> state_buffer;
  SelectionVector sel_vector;
  AggregateInputData aggr_input_data;
  LogicalType local_220;
  StateVector state_vector;
  UnifiedVectorFormat lists_data;
  Vector slice;
  Vector state_vector_update;
  UnifiedVectorFormat child_data;
  
  iVar11 = args->count;
  vec = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  Vector::SetVectorType(result,FLAT_VECTOR);
  FlatVector::VerifyFlatVector(result);
  if ((vec->type).id_ == SQLNULL) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    ConstantVector::SetNull(result,true);
    return;
  }
  pBVar2 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  pFVar3 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->(&pBVar2->bind_info);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)(pFVar3 + 4));
  pBVar5 = BaseExpression::Cast<duckdb::BoundAggregateExpression>(&pEVar4->super_BaseExpression);
  state_vector.count = (idx_t)state[1]._vptr_ExpressionState;
  pFVar6 = optional_ptr<duckdb::FunctionLocalState,_true>::operator->
                     ((optional_ptr<duckdb::FunctionLocalState,_true> *)&state_vector);
  ArenaAllocator::Reset((ArenaAllocator *)(pFVar6 + 1));
  aggr_input_data.bind_data.ptr =
       (pBVar5->bind_info).
       super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  aggr_input_data.combine_type = PRESERVE_INPUT;
  aggr_input_data.allocator = (ArenaAllocator *)(pFVar6 + 1);
  iVar7 = ListVector::GetListSize(vec);
  this = ListVector::GetEntry(vec);
  Vector::Flatten(this,iVar7);
  UnifiedVectorFormat::UnifiedVectorFormat(&child_data);
  Vector::ToUnifiedFormat(this,iVar7,&child_data);
  UnifiedVectorFormat::UnifiedVectorFormat(&lists_data);
  Vector::ToUnifiedFormat(vec,iVar11,&lists_data);
  iVar7 = (*(pBVar5->function).state_size)(&pBVar5->function);
  state_buffer.super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
       operator_new__(iVar7 * iVar11);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)(pFVar3 + 4));
  (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_2a8,pEVar4);
  StateVector::StateVector
            (&state_vector,iVar11,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_2a8);
  if (local_2a8._M_head_impl != (Expression *)0x0) {
    (*((local_2a8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_2a8._M_head_impl = (Expression *)0x0;
  LogicalType::LogicalType(&local_220,POINTER);
  Vector::Vector(&state_vector_update,&local_220,0x800);
  LogicalType::~LogicalType(&local_220);
  SelectionVector::SelectionVector(&sel_vector,0x800);
  count = 0;
  local_2a0 = iVar11;
  for (row_idx = 0; iVar11 = local_2a0, row_idx != local_2a0; row_idx = row_idx + 1) {
    pdVar9 = (data_ptr_t)
             (row_idx * iVar7 +
             (long)state_buffer.
                   super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
    *(data_ptr_t *)(state_vector.state_vector.data + row_idx * 8) = pdVar9;
    (*(pBVar5->function).initialize)(&pBVar5->function,pdVar9);
    iVar11 = row_idx;
    if ((lists_data.sel)->sel_vector != (sel_t *)0x0) {
      iVar11 = (idx_t)(lists_data.sel)->sel_vector[row_idx];
    }
    if ((lists_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((lists_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar11 >> 6]
         >> (iVar11 & 0x3f) & 1) != 0)) {
      plVar12 = (long *)(lists_data.data + iVar11 * 0x10);
      uVar8 = plVar12[1];
      if (uVar8 != 0) {
        for (uVar10 = 0; uVar10 < uVar8; uVar10 = uVar10 + 1) {
          if (count == 0x800) {
            Vector::Vector(&slice,this,&sel_vector,0x800);
            (*(pBVar5->function).update)(&slice,&aggr_input_data,1,&state_vector_update,0x800);
            Vector::~Vector(&slice);
            count = 0;
          }
          uVar8 = *plVar12 + uVar10;
          if ((child_data.sel)->sel_vector != (sel_t *)0x0) {
            uVar8 = (ulong)(child_data.sel)->sel_vector[uVar8];
          }
          sel_vector.sel_vector[count] = (sel_t)uVar8;
          *(data_ptr_t *)(state_vector_update.data + count * 8) = pdVar9;
          count = count + 1;
          uVar8 = plVar12[1];
        }
      }
    }
    else {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
    }
  }
  if (count != 0) {
    Vector::Vector(&slice,this,&sel_vector,count);
    (*(pBVar5->function).update)(&slice,&aggr_input_data,1,&state_vector_update,count);
    Vector::~Vector(&slice);
  }
  other = vector<duckdb::LogicalType,_true>::get<true>
                    (&(pBVar5->function).super_BaseScalarFunction.super_SimpleFunction.arguments,0);
  LogicalType::LogicalType((LogicalType *)&slice,other);
  switch(slice._1_1_) {
  case (BADTYPE)0x1:
    DistinctFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,bool,std::unordered_map<bool,unsigned_long,std::hash<bool>,std::equal_to<bool>,std::allocator<std::pair<bool_const,unsigned_long>>>>
              (result,&state_vector.state_vector,iVar11);
    break;
  case (BADTYPE)0x2:
    DistinctFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,unsigned_char,std::unordered_map<unsigned_char,unsigned_long,std::hash<unsigned_char>,std::equal_to<unsigned_char>,std::allocator<std::pair<unsigned_char_const,unsigned_long>>>>
              (result,&state_vector.state_vector,iVar11);
    break;
  case (BADTYPE)0x3:
    DistinctFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,signed_char,std::unordered_map<signed_char,unsigned_long,std::hash<signed_char>,std::equal_to<signed_char>,std::allocator<std::pair<signed_char_const,unsigned_long>>>>
              (result,&state_vector.state_vector,iVar11);
    break;
  case (BADTYPE)0x4:
    DistinctFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,unsigned_short,std::unordered_map<unsigned_short,unsigned_long,std::hash<unsigned_short>,std::equal_to<unsigned_short>,std::allocator<std::pair<unsigned_short_const,unsigned_long>>>>
              (result,&state_vector.state_vector,iVar11);
    break;
  case (BADTYPE)0x5:
    DistinctFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,short,std::unordered_map<short,unsigned_long,std::hash<short>,std::equal_to<short>,std::allocator<std::pair<short_const,unsigned_long>>>>
              (result,&state_vector.state_vector,iVar11);
    break;
  case (BADTYPE)0x6:
    DistinctFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,unsigned_int,std::unordered_map<unsigned_int,unsigned_long,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>>
              (result,&state_vector.state_vector,iVar11);
    break;
  case (BADTYPE)0x7:
    DistinctFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,int,std::unordered_map<int,unsigned_long,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,unsigned_long>>>>
              (result,&state_vector.state_vector,iVar11);
    break;
  case (BADTYPE)0x8:
    DistinctFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,unsigned_long,std::unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>
              (result,&state_vector.state_vector,iVar11);
    break;
  case (BADTYPE)0x9:
    DistinctFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,long,std::unordered_map<long,unsigned_long,std::hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,unsigned_long>>>>
              (result,&state_vector.state_vector,iVar11);
    break;
  case (BADTYPE)0xb:
    DistinctFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,float,std::unordered_map<float,unsigned_long,std::hash<float>,std::equal_to<float>,std::allocator<std::pair<float_const,unsigned_long>>>>
              (result,&state_vector.state_vector,iVar11);
    break;
  case (BADTYPE)0xc:
    DistinctFunctor::
    ListExecuteFunction<duckdb::FinalizeValueFunctor,double,std::unordered_map<double,unsigned_long,std::hash<double>,std::equal_to<double>,std::allocator<std::pair<double_const,unsigned_long>>>>
              (result,&state_vector.state_vector,iVar11);
    break;
  default:
    if (slice._1_1_ == -0x38) {
      DistinctFunctor::
      ListExecuteFunction<duckdb::FinalizeStringValueFunctor,duckdb::string_t,duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>
                (result,&state_vector.state_vector,iVar11);
      break;
    }
  case (BADTYPE)0xa:
    DistinctFunctor::
    ListExecuteFunction<duckdb::FinalizeGenericValueFunctor,duckdb::string_t,duckdb::OwningStringMap<unsigned_long,std::unordered_map<duckdb::string_t,unsigned_long,duckdb::StringHash,duckdb::StringEquality,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>
              (result,&state_vector.state_vector,iVar11);
  }
  LogicalType::~LogicalType((LogicalType *)&slice);
  bVar1 = DataChunk::AllConstant(args);
  if (bVar1) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sel_vector.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Vector::~Vector(&state_vector_update);
  StateVector::~StateVector(&state_vector);
  ::std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            (&state_buffer.super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
  ;
  UnifiedVectorFormat::~UnifiedVectorFormat(&lists_data);
  UnifiedVectorFormat::~UnifiedVectorFormat(&child_data);
  return;
}

Assistant:

static void ListDistinctFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 1);
	ListAggregatesFunction<DistinctFunctor>(args, state, result);
}